

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.h
# Opt level: O0

cmCommand * __thiscall cmForEachCommand::Clone(cmForEachCommand *this)

{
  cmCommand *this_00;
  cmForEachCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmForEachCommand((cmForEachCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmForEachCommand; }